

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_alternative_serial.cpp
# Opt level: O0

void test_break(void)

{
  double __x;
  allocator<char> local_51;
  string local_50;
  undefined1 local_30 [47];
  Printer<__filename,___prefix> __tracer;
  
  SpyingSerial::clear(&Serial2);
  ArduinoTrace::Printer<test_break()::__filename,test_break()::__prefix>::
  Printer<SpyingSerial,char[35]>
            ((Printer<test_break()::__filename,test_break()::__prefix> *)(local_30 + 0x27),&Serial2,
             (char (*) [35])"BREAK! (press [enter] to continue)");
  ArduinoTrace::pause<SpyingSerial>(&Serial2);
  SpyingSerial::log_abi_cxx11_((SpyingSerial *)local_30,__x);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,
             "test_alternative_serial.cpp:\\d+: BREAK.+\r\nflush\\(\\)\r\nread\\(\\)\r\n",&local_51)
  ;
  ASSERT_RE((string *)local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void test_break() {
  Serial2.clear();
  BREAK();
  ASSERT_RE(Serial2.log(),
            "test_alternative_serial.cpp:\\d+: BREAK.+\r\n"
            "flush\\(\\)\r\n"
            "read\\(\\)\r\n");
}